

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_util.c
# Opt level: O0

char * archive_version_details(void)

{
  void *in_RAX;
  archive_string *unaff_retaddr;
  
  if (archive_version_details::init == 0) {
    archive_version_details::str.s = (char *)0x0;
    archive_version_details::str.length = 0;
    archive_version_details::str.buffer_length = 0;
    archive_strcat(unaff_retaddr,in_RAX);
    archive_strcat(unaff_retaddr,in_RAX);
    archive_strcat(unaff_retaddr,in_RAX);
    archive_strcat(unaff_retaddr,in_RAX);
    archive_strcat(unaff_retaddr,in_RAX);
  }
  return archive_version_details::str.s;
}

Assistant:

const char *
archive_version_details(void)
{
	static struct archive_string str;
	static int init = 0;

	if (!init) {
		archive_string_init(&str);

		archive_strcat(&str, ARCHIVE_VERSION_STRING);
#ifdef HAVE_ZLIB_H
		archive_strcat(&str, " zlib/");
		archive_strcat(&str, ZLIB_VERSION);
#endif
#ifdef HAVE_LZMA_H
		archive_strcat(&str, " liblzma/");
		archive_strcat(&str, LZMA_VERSION_STRING);
#endif
#ifdef HAVE_BZLIB_H
		{
			const char *p = BZ2_bzlibVersion();
			const char *sep = strchr(p, ',');
			if (sep == NULL)
				sep = p + strlen(p);
			archive_strcat(&str, " bz2lib/");
			archive_strncat(&str, p, sep - p);
		}
#endif
	    }
	return str.s;
}